

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::CumulativeReporterBase::BySectionInfo::operator()
          (BySectionInfo *this,Ptr<Catch::CumulativeReporterBase::SectionNode> *node)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  if ((node->m_p->stats).sectionInfo.lineInfo.line != (this->m_other->lineInfo).line) {
    return false;
  }
  __s1 = (node->m_p->stats).sectionInfo.lineInfo.file;
  __s2 = (this->m_other->lineInfo).file;
  if (__s1 != __s2) {
    iVar1 = strcmp(__s1,__s2);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

T* operator->() const { return m_p; }